

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall Mesh::draw_mesh(Mesh *this,uint program_ID,uint zprogram,ZRender *zrender)

{
  size_type *psVar1;
  pointer pTVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  PFNGLGETUNIFORMLOCATIONPROC p_Var5;
  PFNGLUNIFORM1FPROC p_Var6;
  PFNGLUNIFORM1IPROC p_Var7;
  char cVar8;
  char cVar9;
  GLint GVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  GLenum GVar14;
  ulong uVar15;
  void *pvVar16;
  undefined1 local_a8 [8];
  string texture_type;
  undefined1 local_80 [8];
  string number;
  string __str;
  uint local_38;
  uint local_34;
  
  __str.field_2._12_4_ = program_ID;
  (*glad_glBindVertexArray)(this->VAO);
  (*glad_glBindFramebuffer)(0x8d40,zrender->depthFBO);
  (*glad_glUseProgram)(zprogram);
  p_Var7 = glad_glUniform1i;
  GVar10 = (*glad_glGetUniformLocation)(zprogram,"zbuffer");
  (*p_Var7)(GVar10,0);
  (*glad_glActiveTexture)(0x84c0);
  texture_type.field_2._8_8_ = zrender;
  (*glad_glBindTexture)(0xde1,zrender->activeDepth);
  if (8 < (ulong)((long)(this->indices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    pvVar16 = (void *)0x0;
    uVar15 = 0;
    do {
      (*glad_glDrawElements)(4,3,0x1405,pvVar16);
      uVar15 = uVar15 + 1;
      pvVar16 = (void *)((long)pvVar16 + 0xc);
    } while (uVar15 < (ulong)((long)(this->indices).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->indices).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) / 3);
  }
  (*glad_glBindFramebuffer)(0x8d40,*(GLuint *)(texture_type.field_2._8_8_ + 0x20));
  (*glad_glUseProgram)(__str.field_2._12_4_);
  if ((this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_34 = 1;
    uVar15 = 0;
    local_38 = 1;
    do {
      GVar14 = (int)uVar15 + 0x84c0;
      (*glad_glActiveTexture)(GVar14);
      number._M_dataplus._M_p = (pointer)0x0;
      number._M_string_length._0_1_ = 0;
      pTVar2 = (this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a8 = (undefined1  [8])&texture_type._M_string_length;
      _Var3._M_p = pTVar2[uVar15].type._M_dataplus._M_p;
      local_80 = (undefined1  [8])&number._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,_Var3._M_p,_Var3._M_p + pTVar2[uVar15].type._M_string_length);
      iVar11 = std::__cxx11::string::compare((char *)local_a8);
      psVar1 = &__str._M_string_length;
      if (iVar11 == 0) {
        cVar9 = '\x01';
        if (9 < local_38) {
          uVar13 = local_38;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (uVar13 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_0011fe5b;
            }
            if (uVar13 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_0011fe5b;
            }
            if (uVar13 < 10000) goto LAB_0011fe5b;
            bVar4 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar4);
          cVar9 = cVar9 + '\x01';
        }
LAB_0011fe5b:
        number.field_2._8_8_ = psVar1;
        std::__cxx11::string::_M_construct((ulong)(number.field_2._M_local_buf + 8),cVar9);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)number.field_2._8_8_,(uint)__str._M_dataplus._M_p,local_38);
        std::__cxx11::string::operator=
                  ((string *)local_80,(string *)(number.field_2._M_local_buf + 8));
        if ((size_type *)number.field_2._8_8_ != psVar1) {
          operator_delete((void *)number.field_2._8_8_,__str._M_string_length + 1);
        }
        local_38 = local_38 + 1;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)local_a8);
        if (iVar11 == 0) {
          cVar9 = '\x01';
          if (9 < local_34) {
            uVar13 = local_34;
            cVar8 = '\x04';
            do {
              cVar9 = cVar8;
              if (uVar13 < 100) {
                cVar9 = cVar9 + -2;
                goto LAB_0011fea7;
              }
              if (uVar13 < 1000) {
                cVar9 = cVar9 + -1;
                goto LAB_0011fea7;
              }
              if (uVar13 < 10000) goto LAB_0011fea7;
              bVar4 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar8 = cVar9 + '\x04';
            } while (bVar4);
            cVar9 = cVar9 + '\x01';
          }
LAB_0011fea7:
          number.field_2._8_8_ = psVar1;
          std::__cxx11::string::_M_construct((ulong)(number.field_2._M_local_buf + 8),cVar9);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)number.field_2._8_8_,(uint)__str._M_dataplus._M_p,local_34);
          std::__cxx11::string::operator=
                    ((string *)local_80,(string *)(number.field_2._M_local_buf + 8));
          if ((size_type *)number.field_2._8_8_ != psVar1) {
            operator_delete((void *)number.field_2._8_8_,__str._M_string_length + 1);
          }
          local_34 = local_34 + 1;
        }
      }
      p_Var6 = glad_glUniform1f;
      p_Var5 = glad_glGetUniformLocation;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&number.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      GVar10 = (*p_Var5)(__str.field_2._12_4_,(GLchar *)number.field_2._8_8_);
      (*p_Var6)(GVar10,(float)uVar15);
      if ((size_type *)number.field_2._8_8_ != &__str._M_string_length) {
        operator_delete((void *)number.field_2._8_8_,__str._M_string_length + 1);
      }
      (*glad_glActiveTexture)(GVar14);
      (*glad_glBindTexture)
                (0xde1,(this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15].id);
      if (local_a8 != (undefined1  [8])&texture_type._M_string_length) {
        operator_delete((void *)local_a8,texture_type._M_string_length + 1);
      }
      if (local_80 != (undefined1  [8])&number._M_string_length) {
        operator_delete((void *)local_80,
                        CONCAT71(number._M_string_length._1_7_,(undefined1)number._M_string_length)
                        + 1);
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      uVar12 = ((long)(this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    } while (uVar15 <= uVar12 && uVar12 - uVar15 != 0);
  }
  Render::ZRender::bindBuffers((ZRender *)texture_type.field_2._8_8_,__str.field_2._12_4_);
  if (8 < (ulong)((long)(this->indices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    pvVar16 = (void *)0x0;
    uVar15 = 0;
    do {
      (*glad_glDrawElements)(4,3,0x1405,pvVar16);
      uVar15 = uVar15 + 1;
      pvVar16 = (void *)((long)pvVar16 + 0xc);
    } while (uVar15 < (ulong)((long)(this->indices).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->indices).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) / 3);
  }
  return;
}

Assistant:

void Mesh::draw_mesh(unsigned int program_ID, unsigned int zprogram, Render::ZRender& zrender)
{

  glBindVertexArray(VAO);

  glBindFramebuffer(GL_FRAMEBUFFER,zrender.depthFBO);   
  glUseProgram(zprogram);
  glUniform1i(glGetUniformLocation(zprogram,"zbuffer"),0);
  glActiveTexture(GL_TEXTURE0);

  glBindTexture(GL_TEXTURE_2D,zrender.activeDepth);

  for (int j = 0; j < indices.size()/3; j++)
    glDrawElements(GL_TRIANGLES,3,GL_UNSIGNED_INT,reinterpret_cast<void*>(j*3*sizeof(unsigned int)));

  

 glBindFramebuffer(GL_FRAMEBUFFER,zrender.colorFBO);
 glUseProgram(program_ID);

   unsigned int diffuse_count = 1;
   unsigned int specular_count = 1;
   for (unsigned int i = 0; i < textures.size(); i++) {
     glActiveTexture(GL_TEXTURE0 + i); // activate proper texture unit before binding
     std::string number;
     std::string texture_type = textures[i].type;
     if (texture_type == "texture_diffuse") {
	number = std::to_string(diffuse_count++);
     } else if (texture_type == "texture_specular") {
	number = std::to_string(specular_count++);
     }

     // do I not need to use program here?
     glUniform1f(glGetUniformLocation(program_ID,
				       (texture_type + number).c_str()), i);
     glActiveTexture(GL_TEXTURE0 + i); // wait why this again?
     glBindTexture(GL_TEXTURE_2D, textures[i].id);
   }
  zrender.bindBuffers(program_ID);
  for (int j = 0; j < indices.size()/3; j++)
  {
    glDrawElements(GL_TRIANGLES,3,GL_UNSIGNED_INT,reinterpret_cast<void*>(j*3*sizeof(unsigned int)));
   }
 
}